

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.cpp
# Opt level: O3

ScalarFunction * duckdb::ListPositionFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff1c;
  FunctionNullHandling in_stack_ffffffffffffff28;
  allocator_type local_d1;
  code *bind_lambda;
  LogicalType local_b0;
  LogicalType local_98;
  vector<duckdb::LogicalType,_true> local_80;
  LogicalType local_68;
  LogicalType local_50 [2];
  
  LogicalType::LogicalType(&local_b0,ANY);
  LogicalType::LIST(local_50,&local_b0);
  LogicalType::LogicalType(local_50 + 1,ANY);
  __l._M_len = 2;
  __l._M_array = local_50;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80,__l,
             &local_d1);
  LogicalType::LogicalType(&local_98,INTEGER);
  bind_lambda = ListSearchFunction<true>;
  LogicalType::LogicalType(&local_68,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_68;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff14;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff1c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_80,&local_98,(scalar_function_t *)&stack0xffffffffffffff30,ListSearchBind
             ,(bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
             (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_ffffffffffffff28,bind_lambda);
  LogicalType::~LogicalType(&local_68);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff30,(_Any_data *)&stack0xffffffffffffff30,
               __destroy_functor);
  LogicalType::~LogicalType(&local_98);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_50[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_b0);
  return in_RDI;
}

Assistant:

ScalarFunction ListPositionFun::GetFunction() {
	return ScalarFunction({LogicalType::LIST(LogicalType::ANY), LogicalType::ANY}, LogicalType::INTEGER,
	                      ListSearchFunction<true>, ListSearchBind);
}